

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O1

reentrant_put_transaction<void> *
density_tests::detail::
PutTestObject<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>,_2048UL,_2048UL>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uintptr_t uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)&stack0xffffffffffffffe0 & 0xfffffffffffff800;
  *(undefined8 *)(uVar5 - 0x1808) = 0xdadb11;
  TestObject<2048UL,_2048UL>::TestObject((TestObject<2048UL,_2048UL> *)(uVar5 - 0x1000));
  *(undefined8 *)(uVar5 - 0x1808) = 0xdadb24;
  density::
  sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  start_reentrant_emplace<density_tests::TestObject<2048ul,2048ul>,density_tests::TestObject<2048ul,2048ul>>
            ((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)
             (uVar5 - 0x1020),
             (sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)i_queue,(TestObject<2048UL,_2048UL> *)(uVar5 - 0x1000));
  uVar1 = *(undefined8 *)(uVar5 - 0x1018);
  uVar2 = *(undefined8 *)(uVar5 - 0x1010);
  uVar3 = *(undefined8 *)(uVar5 - 0x1008);
  *(undefined8 *)(uVar5 - 0x1040) = *(undefined8 *)(uVar5 - 0x1020);
  *(undefined8 *)(uVar5 - 0x1038) = uVar1;
  *(undefined8 *)(uVar5 - 0x1030) = uVar2;
  *(undefined8 *)(uVar5 - 0x1028) = uVar3;
  *(undefined8 *)(uVar5 - 0x1808) = 0xdadb51;
  TestObject<2048UL,_2048UL>::~TestObject((TestObject<2048UL,_2048UL> *)(uVar5 - 0x1000));
  *(undefined8 *)(uVar5 - 0x1808) = 0xdadb56;
  exception_checkpoint();
  (__return_storage_ptr__->m_put).m_user_storage = *(void **)(uVar5 - 0x1030);
  uVar4 = *(uintptr_t *)(uVar5 - 0x1038);
  (__return_storage_ptr__->m_put).m_control_block = *(LfQueueControl **)(uVar5 - 0x1040);
  (__return_storage_ptr__->m_put).m_next_ptr = uVar4;
  __return_storage_ptr__->m_queue =
       *(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
         **)(uVar5 - 0x1028);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(ElementType());
                exception_checkpoint();
                return std::move(transaction);
            }